

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

void __thiscall pybind11::arg_v::arg_v<pybind11::none>(arg_v *this,arg *base,none *x,char *descr)

{
  undefined8 uVar1;
  PyObject *pPVar2;
  
  uVar1 = *(undefined8 *)&base->field_0x8;
  (this->super_arg).name = base->name;
  *(undefined8 *)&(this->super_arg).field_0x8 = uVar1;
  pPVar2 = (x->super_object).super_handle.m_ptr;
  if (pPVar2 == (PyObject *)0x0) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2->ob_refcnt = pPVar2->ob_refcnt + 1;
    pPVar2 = (x->super_object).super_handle.m_ptr;
  }
  (this->value).super_handle.m_ptr = pPVar2;
  this->descr = descr;
  type_id<pybind11::none>();
  return;
}

Assistant:

arg_v(arg &&base, T &&x, const char *descr = nullptr)
        : arg(base),
          value(reinterpret_steal<object>(
              detail::make_caster<T>::cast(x, return_value_policy::automatic, {})
          )),
          descr(descr)
#if !defined(NDEBUG)
        , type(type_id<T>())
#endif
    { }